

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

BackgroundProjections ON_Environment::ProjectionFromString(wchar_t *wsz)

{
  int iVar1;
  wchar_t *wsz_local;
  
  iVar1 = on_wcsicmp(L"planar",wsz);
  if (iVar1 == 0) {
    wsz_local._4_4_ = Planar;
  }
  else {
    iVar1 = on_wcsicmp(L"spherical",wsz);
    if (iVar1 == 0) {
      wsz_local._4_4_ = Spherical;
    }
    else {
      iVar1 = on_wcsicmp(L"emap",wsz);
      if (iVar1 == 0) {
        wsz_local._4_4_ = Emap;
      }
      else {
        iVar1 = on_wcsicmp(L"box",wsz);
        if (iVar1 == 0) {
          wsz_local._4_4_ = Box;
        }
        else {
          iVar1 = on_wcsicmp(L"lightprobe",wsz);
          if (iVar1 == 0) {
            wsz_local._4_4_ = LightProbe;
          }
          else {
            iVar1 = on_wcsicmp(L"cubemap",wsz);
            if (iVar1 == 0) {
              wsz_local._4_4_ = CubeMap;
            }
            else {
              iVar1 = on_wcsicmp(L"vertical-cross-cubemap",wsz);
              if (iVar1 == 0) {
                wsz_local._4_4_ = VerticalCrossCubeMap;
              }
              else {
                iVar1 = on_wcsicmp(L"horizontal-cross-cubemap",wsz);
                if (iVar1 == 0) {
                  wsz_local._4_4_ = HorizontalCrossCubeMap;
                }
                else {
                  iVar1 = on_wcsicmp(L"hemispherical",wsz);
                  if (iVar1 == 0) {
                    wsz_local._4_4_ = Hemispherical;
                  }
                  else {
                    ON_REMOVE_ASAP_AssertEx
                              (0,
                               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_render_content.cpp"
                               ,0xc1,"","false is false");
                    wsz_local._4_4_ = Planar;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return wsz_local._4_4_;
}

Assistant:

ON_Environment::BackgroundProjections ON_Environment::ProjectionFromString(const wchar_t* wsz) // Static.
{
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_PLANAR, wsz))        return BackgroundProjections::Planar;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_SPHERICAL, wsz))     return BackgroundProjections::Spherical;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_EMAP, wsz))          return BackgroundProjections::Emap;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_BOX, wsz))           return BackgroundProjections::Box;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_LIGHT_PROBE, wsz))   return BackgroundProjections::LightProbe;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_CUBE_MAP, wsz))      return BackgroundProjections::CubeMap;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_CUBE_MAP_VERT, wsz)) return BackgroundProjections::VerticalCrossCubeMap;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_CUBE_MAP_HORZ, wsz)) return BackgroundProjections::HorizontalCrossCubeMap;
  if (0 == on_wcsicmp(ON_ENVIRONMENT_PROJECTION_HEMISPHERICAL, wsz)) return BackgroundProjections::Hemispherical;

  ON_ASSERT(false);
  return BackgroundProjections::Planar;
}